

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O2

void resizestack(lua_State *L,MSize n)

{
  int *piVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  GCRef *pGVar5;
  ulong uVar6;
  void *p;
  
  p = (void *)(ulong)(L->stack).ptr32;
  uVar2 = L->stacksize;
  pvVar3 = lj_mem_realloc(L,p,uVar2 * 8,n * 8 + 0x30);
  (L->stack).ptr32 = (uint32_t)pvVar3;
  (L->maxstack).ptr32 = (uint32_t)pvVar3 + n * 8;
  for (uVar6 = (ulong)uVar2; uVar6 < n + 6; uVar6 = uVar6 + 1) {
    *(undefined4 *)((long)pvVar3 + uVar6 * 8 + 4) = 0xffffffff;
  }
  lVar4 = (long)pvVar3 - (long)p;
  L->stacksize = n + 6;
  L->base = (TValue *)((long)L->base + lVar4);
  L->top = (TValue *)((long)L->top + lVar4);
  pGVar5 = &L->openupval;
  while( true ) {
    pGVar5 = (GCRef *)(ulong)pGVar5->gcptr32;
    if (pGVar5 == (GCRef *)0x0) break;
    pGVar5[4] = (GCRef)(pGVar5[4].gcptr32 + (int)lVar4);
  }
  uVar6 = (ulong)(L->glref).ptr32;
  if ((lua_State *)(ulong)*(uint *)(uVar6 + 0xf4) == L) {
    piVar1 = (int *)(uVar6 + 0xf8);
    *piVar1 = *piVar1 + (int)lVar4;
  }
  return;
}

Assistant:

static void resizestack(lua_State *L, MSize n)
{
  TValue *st, *oldst = tvref(L->stack);
  ptrdiff_t delta;
  MSize oldsize = L->stacksize;
  MSize realsize = n + 1 + LJ_STACK_EXTRA;
  GCobj *up;
  lua_assert((MSize)(tvref(L->maxstack)-oldst)==L->stacksize-LJ_STACK_EXTRA-1);
  st = (TValue *)lj_mem_realloc(L, tvref(L->stack),
				(MSize)(L->stacksize*sizeof(TValue)),
				(MSize)(realsize*sizeof(TValue)));
  setmref(L->stack, st);
  delta = (char *)st - (char *)oldst;
  setmref(L->maxstack, st + n);
  while (oldsize < realsize)  /* Clear new slots. */
    setnilV(st + oldsize++);
  L->stacksize = realsize;
  L->base = (TValue *)((char *)L->base + delta);
  L->top = (TValue *)((char *)L->top + delta);
  for (up = gcref(L->openupval); up != NULL; up = gcnext(up))
    setmref(gco2uv(up)->v, (TValue *)((char *)uvval(gco2uv(up)) + delta));
  if (obj2gco(L) == gcref(G(L)->jit_L))
    setmref(G(L)->jit_base, mref(G(L)->jit_base, char) + delta);
}